

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O1

CURLcode Curl_ssl_connect(connectdata *conn,int sockindex)

{
  ssl_connect_data *psVar1;
  SSL *pSVar2;
  _Bool _Var3;
  undefined3 uVar4;
  ssl_connection_state sVar5;
  ssl_connect_state sVar6;
  undefined4 uVar7;
  CURLcode CVar8;
  ssl_connect_data *psVar9;
  
  if ((((conn->bits).proxy_ssl_connected[sockindex] == true) &&
      (conn->ssl[sockindex].state == ssl_connection_complete)) &&
     (conn->proxy_ssl[sockindex].use == false)) {
    psVar9 = conn->ssl + sockindex;
    conn->proxy_ssl[sockindex].server_cert = conn->ssl[sockindex].server_cert;
    _Var3 = psVar9->use;
    uVar4 = *(undefined3 *)&psVar9->field_0x1;
    sVar5 = psVar9->state;
    sVar6 = conn->ssl[sockindex].connecting_state;
    uVar7 = *(undefined4 *)&conn->ssl[sockindex].field_0xc;
    pSVar2 = conn->ssl[sockindex].handle;
    conn->proxy_ssl[sockindex].ctx = conn->ssl[sockindex].ctx;
    conn->proxy_ssl[sockindex].handle = pSVar2;
    psVar1 = conn->proxy_ssl + sockindex;
    psVar1->use = _Var3;
    *(undefined3 *)&psVar1->field_0x1 = uVar4;
    psVar1->state = sVar5;
    conn->proxy_ssl[sockindex].connecting_state = sVar6;
    *(undefined4 *)&conn->proxy_ssl[sockindex].field_0xc = uVar7;
    psVar9->use = false;
    *(undefined3 *)&psVar9->field_0x1 = 0;
    psVar9->state = ssl_connection_none;
    *(undefined8 *)&conn->ssl[sockindex].connecting_state = 0;
    conn->ssl[sockindex].ctx = (SSL_CTX *)0x0;
    conn->ssl[sockindex].handle = (SSL *)0x0;
    conn->ssl[sockindex].server_cert = (X509 *)0x0;
  }
  if ((ulong)(conn->data->set).ssl.primary.version < 8) {
    conn->ssl[sockindex].use = true;
    conn->ssl[sockindex].state = ssl_connection_negotiating;
    CVar8 = Curl_ossl_connect(conn,sockindex);
    if (CVar8 == CURLE_OK) {
      Curl_pgrsTime(conn->data,TIMER_APPCONNECT);
    }
  }
  else {
    Curl_failf(conn->data,"Unrecognized parameter value passed via CURLOPT_SSLVERSION");
    CVar8 = CURLE_SSL_CONNECT_ERROR;
  }
  return CVar8;
}

Assistant:

CURLcode
Curl_ssl_connect(struct connectdata *conn, int sockindex)
{
  CURLcode result;

  if(conn->bits.proxy_ssl_connected[sockindex]) {
    result = ssl_connect_init_proxy(conn, sockindex);
    if(result)
      return result;
  }

  if(!ssl_prefs_check(conn->data))
    return CURLE_SSL_CONNECT_ERROR;

  /* mark this is being ssl-enabled from here on. */
  conn->ssl[sockindex].use = TRUE;
  conn->ssl[sockindex].state = ssl_connection_negotiating;

  result = curlssl_connect(conn, sockindex);

  if(!result)
    Curl_pgrsTime(conn->data, TIMER_APPCONNECT); /* SSL is connected */

  return result;
}